

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int MemHashCursorSeek(unqlite_kv_cursor *pCursor,void *pKey,int nByte,int iPos)

{
  mem_hash_record *pmVar1;
  mem_hash_cursor *pMem;
  mem_hash_kv_engine *pEngine;
  int iPos_local;
  int nByte_local;
  void *pKey_local;
  unqlite_kv_cursor *pCursor_local;
  
  pmVar1 = MemHashGetEntry((mem_hash_kv_engine *)pCursor->pStore,pKey,nByte);
  pCursor[1].pStore = (unqlite_kv_engine *)pmVar1;
  if (pCursor[1].pStore == (unqlite_kv_engine *)0x0) {
    pCursor_local._4_4_ = -6;
  }
  else {
    pCursor_local._4_4_ = 0;
  }
  return pCursor_local._4_4_;
}

Assistant:

static int MemHashCursorSeek(unqlite_kv_cursor *pCursor,const void *pKey,int nByte,int iPos)
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pCursor->pStore;
	mem_hash_cursor *pMem = (mem_hash_cursor *)pCursor;
	/* Perform the lookup */
	pMem->pCur = MemHashGetEntry(pEngine,pKey,nByte);
	if( pMem->pCur == 0 ){
		if( iPos != UNQLITE_CURSOR_MATCH_EXACT ){
			/* noop; */
		}
		/* No such record */
		return UNQLITE_NOTFOUND;
	}
	return UNQLITE_OK;
}